

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi.c
# Opt level: O2

IceTCommRequest Irecv(IceTCommunicator self,void *buf,int count,IceTEnum datatype,int src,int tag)

{
  IceTCommRequest icet_request;
  undefined *puVar1;
  MPI_Request mpi_request;
  
  if (datatype - 0x8000 < 6) {
    puVar1 = (&PTR_ompi_mpi_byte_00123d70)[datatype - 0x8000];
  }
  else {
    icetRaiseDiagnostic("MPI Communicator received bad data type.",0xfffffffe,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/communication/mpi.c"
                        ,400);
    puVar1 = &ompi_mpi_byte;
  }
  MPI_Irecv(buf,count,puVar1,src,tag,*self->data,&mpi_request);
  icet_request = create_request();
  setMPIRequest(icet_request,mpi_request);
  return icet_request;
}

Assistant:

static IceTCommRequest Irecv(IceTCommunicator self,
                             void *buf,
                             int count,
                             IceTEnum datatype,
                             int src,
                             int tag)
{
    IceTCommRequest icet_request;
    MPI_Request mpi_request;
    MPI_Datatype mpidatatype;

    CONVERT_DATATYPE(datatype, mpidatatype);
    MPI_Irecv(buf, count, mpidatatype, src, tag, MPI_COMM,
              &mpi_request);

    icet_request = create_request();
    setMPIRequest(icet_request, mpi_request);

    return icet_request;
}